

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

longlong * __thiscall JSON::JSONValue::getIntValue(JSONValue *this)

{
  JSONValueType JVar1;
  ostream *poVar2;
  string local_30;
  JSONValue *local_10;
  JSONValue *this_local;
  
  local_10 = this;
  JVar1 = getType(this);
  if (JVar1 != INTEGER) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON int value from ");
    getTypeAsString_abi_cxx11_(&local_30,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (longlong *)this->data;
}

Assistant:

const long long int &JSONValue::getIntValue() const {
#ifdef JSON_TYPE_ERRORS_ON
	if(getType()!=INTEGER)
	cerr << "Error requesting JSON int value from " << getTypeAsString() << endl;
#endif

	return *((long long int*)data);
}